

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O3

uintmax_t __thiscall pstack::Dwarf::Unit::rnglistx(Unit *this,size_t slot)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  int iVar1;
  undefined4 extraout_var;
  uintmax_t uVar2;
  uintmax_t uVar3;
  FormEntry *pFVar4;
  pair<unsigned_long,_unsigned_long> pVar5;
  DIE local_b0;
  undefined1 local_88 [8];
  Attribute attr;
  element_type *local_30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  Elf::Section::io((Section *)&stack0xffffffffffffffd0);
  attr.formp = (FormEntry *)0x0;
  iVar1 = (*local_30->_vptr_Reader[8])();
  this_00._M_pi = _Stack_28._M_pi;
  local_30 = (element_type *)0x0;
  _Stack_28._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  root(&local_b0,this);
  DIE::attribute((Attribute *)local_88,&local_b0,DW_AT_rnglists_base,false);
  DIE::~DIE(&local_b0);
  if (attr.die.unit.super___shared_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = DIE::Attribute::operator_cast_to_unsigned_long((Attribute *)local_88);
  }
  pVar5 = DWARFReader::getlength((DWARFReader *)&attr.formp);
  pFVar4 = (FormEntry *)(slot * pVar5.second + uVar2);
  if (pFVar4 <= (FormEntry *)CONCAT44(extraout_var,iVar1)) {
    attr.formp = pFVar4;
    uVar3 = DWARFReader::getuint((DWARFReader *)&attr.formp,pVar5.second);
    DIE::~DIE((DIE *)local_88);
    if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
    }
    return uVar3 + uVar2;
  }
  __assert_fail("end >= off_",
                "/workspace/llm4binary/github/license_c_cmakelists/peadar[P]pstack/libpstack/dwarf.h"
                ,0x3b2,"void pstack::Dwarf::DWARFReader::setOffset(Elf::Off)");
}

Assistant:

uintmax_t
Unit::rnglistx(size_t slot) {

    DWARFReader r(dwarf->debugRangelists.io(), 0);
    auto attr = root().attribute(DW_AT_rnglists_base);
    auto base = attr.valid() ? uintmax_t(attr) : 0;

    // We need to parse the first part of the header to get the size of the
    // entries in the table.
    auto [ _, dwarflen ] = r.getlength();
    /*
     * We don't need the rest of the fields:
    auto version = r.getuint(2);
    auto address_size = r.getuint(1);
    auto ss_size = r.getuint(1);
    auto offset_entry_count = r.getuint(4);
    */

    // seek to the entry at base + slot ...
    r.setOffset(base + slot * dwarflen);

    // ...then read and add the base.
    return base + r.getuint(dwarflen);
}